

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

depth_first_traverser * __thiscall
clipp::group::depth_first_traverser::next_sibling(depth_first_traverser *this)

{
  pointer pcVar1;
  pointer pcVar2;
  
  pcVar1 = (this->stack_).
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != pcVar1) {
    pcVar1 = pcVar1 + -1;
    do {
      (pcVar1->cur)._M_current = (pcVar1->cur)._M_current + 1;
      pcVar2 = (this->stack_).
               super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pcVar2[-1].cur._M_current != pcVar2[-1].end._M_current) {
        return this;
      }
      (this->stack_).
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish = pcVar2 + -1;
      pcVar1 = pcVar2 + -2;
    } while ((this->stack_).
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start != pcVar2 + -1);
  }
  return this;
}

Assistant:

depth_first_traverser&
        next_sibling() {
            if(stack_.empty()) return *this;
            ++stack_.back().cur;
            //at the end of current group?
            while(stack_.back().cur == stack_.back().end) {
                //go to parent
                stack_.pop_back();
                if(stack_.empty()) return *this;
                //go to next sibling in parent
                ++stack_.back().cur;
            }
            return *this;
        }